

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsed_certificate.cc
# Opt level: O0

shared_ptr<const_bssl::ParsedCertificate> __thiscall
bssl::ParsedCertificate::Create
          (ParsedCertificate *this,UniquePtr<CRYPTO_BUFFER> *backing_data,
          ParseCertificateOptions *options,CertErrors *errors)

{
  bssl *pbVar1;
  uchar *puVar2;
  Input extensions_tlv;
  bool bVar3;
  element_type *peVar4;
  pointer pcVar5;
  uint8_t *data;
  size_t sVar6;
  element_type *peVar7;
  element_type *peVar8;
  _Optional_payload_base<bssl::SignatureAlgorithm> value;
  Input *pIVar9;
  ParsedAuthorityKeyIdentifier *pPVar10;
  pointer value_00;
  ParsedExtension *pPVar11;
  ParsedAuthorityKeyIdentifier *authority_key_identifier;
  size_t extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_00;
  pointer errors_00;
  pointer errors_01;
  shared_ptr<const_bssl::ParsedCertificate> sVar12;
  Input certificate_tlv;
  Input tbs_tlv;
  Input tlv;
  Input name_rdn_sequence;
  Input tlv_00;
  Input name_rdn_sequence_00;
  Input basic_constraints_tlv;
  Input key_usage_tlv;
  Input extension_value;
  Input authority_info_access_tlv;
  Input extension_value_00;
  Input policy_constraints_tlv;
  Input policy_mappings_tlv;
  Input inhibit_any_policy_tlv;
  Input extension_value_01;
  Input extension_value_02;
  Input general_names_tlv;
  Input extension_value_03;
  undefined7 in_stack_fffffffffffffa08;
  undefined1 in_stack_fffffffffffffa0f;
  optional<bssl::ParsedAuthorityKeyIdentifier> local_438;
  Span<const_unsigned_char> local_3e8;
  Span<const_unsigned_char> local_3d8;
  bssl *local_3c8;
  uchar *puStack_3c0;
  uchar *local_3b0;
  size_t sStack_3a8;
  Input *local_3a0;
  Span<const_unsigned_char> local_398;
  Span<const_unsigned_char> local_388;
  size_t local_378;
  uchar *puStack_370;
  _Optional_payload_base<unsigned_char> local_35a;
  Span<const_unsigned_char> local_358;
  Span<const_unsigned_char> local_348;
  bssl *local_338;
  uchar *puStack_330;
  Span<const_unsigned_char> local_328;
  Span<const_unsigned_char> local_318;
  bssl *local_308;
  uchar *puStack_300;
  Span<const_unsigned_char> local_2f8;
  Span<const_unsigned_char> local_2e8;
  bssl *local_2d8;
  uchar *puStack_2d0;
  Span<const_unsigned_char> local_2c8;
  Span<const_unsigned_char> local_2b8;
  bssl *local_2a8;
  uchar *puStack_2a0;
  Span<const_unsigned_char> local_298;
  Span<const_unsigned_char> local_288;
  size_t local_278;
  uchar *puStack_270;
  unique_ptr<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_> local_260;
  Span<const_unsigned_char> local_258;
  Span<const_unsigned_char> local_248;
  uchar *local_238;
  CertErrors *pCStack_230;
  unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_> local_220;
  Span<const_unsigned_char> local_218;
  Span<const_unsigned_char> local_208;
  bssl *local_1f8;
  uchar *puStack_1f0;
  Span<const_unsigned_char> local_1e8;
  Span<const_unsigned_char> local_1d8;
  bssl *local_1c8;
  uchar *puStack_1c0;
  Span<const_unsigned_char> local_1b8;
  Span<const_unsigned_char> local_1a8;
  bssl *local_198;
  uchar *puStack_190;
  Span<const_unsigned_char> local_180;
  Span<const_unsigned_char> local_170;
  undefined1 local_160 [8];
  ParsedExtension extension;
  undefined1 auStack_108 [8];
  Input issuer_value;
  undefined1 auStack_d8 [8];
  Input subject_value;
  Input local_78 [2];
  undefined1 local_50 [8];
  shared_ptr<bssl::ParsedCertificate> result;
  CertErrors unused_errors;
  CertErrors *errors_local;
  ParseCertificateOptions *options_local;
  UniquePtr<CRYPTO_BUFFER> *backing_data_local;
  
  CertErrors::CertErrors
            ((CertErrors *)
             &result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  unused_errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)errors;
  if (errors == (CertErrors *)0x0) {
    unused_errors.nodes_.super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)&result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
  }
  ::std::make_shared<bssl::ParsedCertificate,bssl::ParsedCertificate::PrivateConstructor>
            ((PrivateConstructor *)local_50);
  peVar4 = ::std::
           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::operator=
            (&peVar4->cert_data_,backing_data);
  peVar4 = ::std::
           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  pcVar5 = ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get(&peVar4->cert_data_);
  data = CRYPTO_BUFFER_data(pcVar5);
  peVar4 = ::std::
           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  pcVar5 = ::std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::get(&peVar4->cert_data_);
  sVar6 = CRYPTO_BUFFER_len(pcVar5);
  bssl::der::Input::Input(local_78,data,sVar6);
  peVar4 = ::std::
           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  (peVar4->cert_).data_.data_ = local_78[0].data_.data_;
  (peVar4->cert_).data_.size_ = local_78[0].data_.size_;
  peVar4 = ::std::
           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  pbVar1 = (bssl *)(peVar4->cert_).data_.data_;
  puVar2 = (uchar *)(peVar4->cert_).data_.size_;
  peVar4 = ::std::
           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  peVar7 = ::std::
           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  peVar8 = ::std::
           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_50);
  certificate_tlv.data_.size_ = (size_t)&peVar4->tbs_certificate_tlv_;
  certificate_tlv.data_.data_ = puVar2;
  errors_01 = unused_errors.nodes_.
              super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  bVar3 = ParseCertificate(pbVar1,certificate_tlv,&peVar7->signature_algorithm_tlv_,
                           &(peVar8->signature_value_).bytes_,
                           (BitString *)
                           unused_errors.nodes_.
                           super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (CertErrors *)
                           CONCAT17(in_stack_fffffffffffffa0f,in_stack_fffffffffffffa08));
  if (bVar3) {
    peVar4 = ::std::
             __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    pbVar1 = (bssl *)(peVar4->tbs_certificate_tlv_).data_.data_;
    puVar2 = (uchar *)(peVar4->tbs_certificate_tlv_).data_.size_;
    peVar4 = ::std::
             __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
    tbs_tlv.data_.size_ = (size_t)options;
    tbs_tlv.data_.data_ = puVar2;
    errors_00 = unused_errors.nodes_.
                super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    bVar3 = ParseTbsCertificate(pbVar1,tbs_tlv,(ParseCertificateOptions *)&peVar4->tbs_,
                                (ParsedTbsCertificate *)
                                unused_errors.nodes_.
                                super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                (CertErrors *)errors_01);
    if (bVar3) {
      peVar4 = ::std::
               __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      subject_value.data_.size_ = (size_t)(peVar4->signature_algorithm_tlv_).data_.data_;
      value = (_Optional_payload_base<bssl::SignatureAlgorithm>)
              ParseSignatureAlgorithm((Input)(peVar4->signature_algorithm_tlv_).data_);
      peVar4 = ::std::
               __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      (peVar4->signature_algorithm_).super__Optional_base<bssl::SignatureAlgorithm,_true,_true>.
      _M_payload.super__Optional_payload_base<bssl::SignatureAlgorithm> = value;
      bssl::der::Input::Input((Input *)auStack_d8);
      peVar4 = ::std::
               __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      tlv.data_.size_ = (size_t)auStack_d8;
      tlv.data_.data_ = (uchar *)(peVar4->tbs_).subject_tlv.data_.size_;
      bVar3 = anon_unknown_0::GetSequenceValue
                        ((anon_unknown_0 *)(peVar4->tbs_).subject_tlv.data_.data_,tlv,(Input *)value
                        );
      if (bVar3) {
        issuer_value.data_.size_ = (size_t)auStack_d8;
        peVar4 = ::std::
                 __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        name_rdn_sequence.data_.size_ = &peVar4->normalized_subject_;
        name_rdn_sequence.data_.data_ = subject_value.data_.data_;
        value_00 = unused_errors.nodes_.
                   super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        bVar3 = NormalizeName((bssl *)issuer_value.data_.size_,name_rdn_sequence,
                              (string *)
                              unused_errors.nodes_.
                              super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                              (CertErrors *)errors_00);
        if (bVar3) {
          bssl::der::Input::Input((Input *)auStack_108);
          peVar4 = ::std::
                   __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_50);
          tlv_00.data_.size_ = (size_t)auStack_108;
          tlv_00.data_.data_ = (uchar *)(peVar4->tbs_).issuer_tlv.data_.size_;
          bVar3 = anon_unknown_0::GetSequenceValue
                            ((anon_unknown_0 *)(peVar4->tbs_).issuer_tlv.data_.data_,tlv_00,
                             (Input *)value_00);
          if (bVar3) {
            peVar4 = ::std::
                     __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_50);
            name_rdn_sequence_00.data_.size_ = &peVar4->normalized_issuer_;
            name_rdn_sequence_00.data_.data_ = issuer_value.data_.data_;
            bVar3 = NormalizeName((bssl *)auStack_108,name_rdn_sequence_00,
                                  (string *)
                                  unused_errors.nodes_.
                                  super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (CertErrors *)errors_00);
            if (bVar3) {
              peVar4 = ::std::
                       __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_50);
              bVar3 = ::std::optional::operator_cast_to_bool
                                ((optional *)&(peVar4->tbs_).extensions_tlv);
              if (bVar3) {
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                pIVar9 = ::std::optional<bssl::der::Input>::value(&(peVar4->tbs_).extensions_tlv);
                extension._32_8_ = (pIVar9->data_).data_;
                sVar6 = (pIVar9->data_).size_;
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                extensions_tlv.data_.size_ = sVar6;
                extensions_tlv.data_.data_ = (uchar *)extension._32_8_;
                bVar3 = ParseExtensions(extensions_tlv,&peVar4->extensions_);
                if (!bVar3) {
                  CertErrors::AddError
                            ((CertErrors *)
                             unused_errors.nodes_.
                             super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,
                             "Failed parsing extensions");
                  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                            ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                  goto LAB_005f4444;
                }
                ParsedExtension::ParsedExtension((ParsedExtension *)local_160);
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_180,
                           (uchar (*) [3])&kBasicConstraintsOid);
                bssl::der::Input::Input((Input *)&local_170,local_180);
                pPVar11 = (ParsedExtension *)local_160;
                bVar3 = GetExtension(peVar4,(Input)local_170,pPVar11);
                if (bVar3) {
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  peVar4->has_basic_constraints_ = true;
                  local_198 = (bssl *)extension.oid.data_.size_;
                  puStack_190 = extension.value.data_.data_;
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  basic_constraints_tlv.data_.size_ = &peVar4->basic_constraints_;
                  basic_constraints_tlv.data_.data_ = puStack_190;
                  bVar3 = ParseBasicConstraints
                                    (local_198,basic_constraints_tlv,
                                     (ParsedBasicConstraints *)pPVar11);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing basic constraints");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_1b8,(uchar (*) [3])&kKeyUsageOid);
                bssl::der::Input::Input((Input *)&local_1a8,local_1b8);
                pPVar11 = (ParsedExtension *)local_160;
                bVar3 = GetExtension(peVar4,(Input)local_1a8,pPVar11);
                if (bVar3) {
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  peVar4->has_key_usage_ = true;
                  local_1c8 = (bssl *)extension.oid.data_.size_;
                  puStack_1c0 = extension.value.data_.data_;
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  key_usage_tlv.data_.size_ = &peVar4->key_usage_;
                  key_usage_tlv.data_.data_ = puStack_1c0;
                  bVar3 = ParseKeyUsage(local_1c8,key_usage_tlv,(BitString *)pPVar11);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing key usage");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_1e8,(uchar (*) [3])&kExtKeyUsageOid);
                bssl::der::Input::Input((Input *)&local_1d8,local_1e8);
                pPVar11 = (ParsedExtension *)local_160;
                bVar3 = GetExtension(peVar4,(Input)local_1d8,pPVar11);
                if (bVar3) {
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  peVar4->has_extended_key_usage_ = true;
                  local_1f8 = (bssl *)extension.oid.data_.size_;
                  puStack_1f0 = extension.value.data_.data_;
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  extension_value.data_.size_ = &peVar4->extended_key_usage_;
                  extension_value.data_.data_ = puStack_1f0;
                  bVar3 = ParseEKUExtension(local_1f8,extension_value,
                                            (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                                             *)pPVar11);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing extended key usage");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_218,
                           (uchar (*) [3])&kSubjectAltNameOid);
                bssl::der::Input::Input((Input *)&local_208,local_218);
                peVar7 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                bVar3 = GetExtension(peVar4,(Input)local_208,&peVar7->subject_alt_names_extension_);
                if (bVar3) {
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  local_238 = (peVar4->subject_alt_names_extension_).value.data_.data_;
                  pCStack_230 = (CertErrors *)
                                (peVar4->subject_alt_names_extension_).value.data_.size_;
                  general_names_tlv.data_.size_ = (size_t)local_238;
                  general_names_tlv.data_.data_ = (uchar *)&local_220;
                  GeneralNames::Create(general_names_tlv,pCStack_230);
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
                  operator=(&peVar4->subject_alt_names_,&local_220);
                  ::std::unique_ptr<bssl::GeneralNames,_std::default_delete<bssl::GeneralNames>_>::
                  ~unique_ptr(&local_220);
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  bVar3 = ::std::unique_ptr::operator_cast_to_bool
                                    ((unique_ptr *)&peVar4->subject_alt_names_);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing subjectAltName");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                  bVar3 = bssl::der::Input::empty((Input *)auStack_d8);
                  if ((bVar3) &&
                     (peVar4 = ::std::
                               __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)local_50),
                     ((peVar4->subject_alt_names_extension_).critical & 1U) == 0)) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Empty subject and subjectAltName is not critical");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_258,
                           (uchar (*) [3])&kNameConstraintsOid);
                bssl::der::Input::Input((Input *)&local_248,local_258);
                bVar3 = GetExtension(peVar4,(Input)local_248,(ParsedExtension *)local_160);
                if (bVar3) {
                  local_278 = extension.oid.data_.size_;
                  puStack_270 = extension.value.data_.data_;
                  extension_value_03.data_.size_ = extension.oid.data_.size_;
                  extension_value_03.data_.data_ = (uchar *)&local_260;
                  errors_00 = unused_errors.nodes_.
                              super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage;
                  NameConstraints::Create
                            (extension_value_03,SUB81(extension.value.data_.data_,0),
                             (CertErrors *)(ulong)((byte)extension.value.data_.size_ & 1));
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  ::std::
                  unique_ptr<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>::
                  operator=(&peVar4->name_constraints_,&local_260);
                  ::std::
                  unique_ptr<bssl::NameConstraints,_std::default_delete<bssl::NameConstraints>_>::
                  ~unique_ptr(&local_260);
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  bVar3 = ::std::unique_ptr::operator_cast_to_bool
                                    ((unique_ptr *)&peVar4->name_constraints_);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing name constraints");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<8ul>
                          ((Span<unsigned_char_const> *)&local_298,
                           (uchar (*) [8])&kAuthorityInfoAccessOid);
                bssl::der::Input::Input((Input *)&local_288,local_298);
                peVar7 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                bVar3 = GetExtension(peVar4,(Input)local_288,
                                     &peVar7->authority_info_access_extension_);
                if (bVar3) {
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  peVar4->has_authority_info_access_ = true;
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  local_2a8 = (bssl *)(peVar4->authority_info_access_extension_).value.data_.data_;
                  puStack_2a0 = (uchar *)(peVar4->authority_info_access_extension_).value.data_.
                                         size_;
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  peVar7 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  authority_info_access_tlv.data_.size_ = (size_t)&peVar4->ca_issuers_uris_;
                  authority_info_access_tlv.data_.data_ = puStack_2a0;
                  bVar3 = ParseAuthorityInfoAccessURIs
                                    (local_2a8,authority_info_access_tlv,&peVar7->ocsp_uris_,
                                     (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                                      *)errors_00);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing authority info access");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_2c8,
                           (uchar (*) [3])&kCertificatePoliciesOid);
                bssl::der::Input::Input((Input *)&local_2b8,local_2c8);
                bVar3 = GetExtension(peVar4,(Input)local_2b8,(ParsedExtension *)local_160);
                if (bVar3) {
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  peVar4->has_policy_oids_ = true;
                  local_2d8 = (bssl *)extension.oid.data_.size_;
                  puStack_2d0 = extension.value.data_.data_;
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  extension_value_00.data_.size_ = 0;
                  extension_value_00.data_.data_ = puStack_2d0;
                  bVar3 = ParseCertificatePoliciesExtensionOids
                                    (local_2d8,extension_value_00,(bool)((char)peVar4 + '8'),
                                     (vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)
                                     unused_errors.nodes_.
                                     super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                     (CertErrors *)errors_01);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing certificate policies");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_2f8,
                           (uchar (*) [3])&kPolicyConstraintsOid);
                bssl::der::Input::Input((Input *)&local_2e8,local_2f8);
                pPVar11 = (ParsedExtension *)local_160;
                bVar3 = GetExtension(peVar4,(Input)local_2e8,pPVar11);
                if (bVar3) {
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  peVar4->has_policy_constraints_ = true;
                  local_308 = (bssl *)extension.oid.data_.size_;
                  puStack_300 = extension.value.data_.data_;
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  policy_constraints_tlv.data_.size_ = &peVar4->policy_constraints_;
                  policy_constraints_tlv.data_.data_ = puStack_300;
                  bVar3 = ParsePolicyConstraints
                                    (local_308,policy_constraints_tlv,
                                     (ParsedPolicyConstraints *)pPVar11);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing policy constraints");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_328,
                           (uchar (*) [3])&kPolicyMappingsOid);
                bssl::der::Input::Input((Input *)&local_318,local_328);
                pPVar11 = (ParsedExtension *)local_160;
                bVar3 = GetExtension(peVar4,(Input)local_318,pPVar11);
                if (bVar3) {
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  peVar4->has_policy_mappings_ = true;
                  local_338 = (bssl *)extension.oid.data_.size_;
                  puStack_330 = extension.value.data_.data_;
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  policy_mappings_tlv.data_.size_ = &peVar4->policy_mappings_;
                  policy_mappings_tlv.data_.data_ = puStack_330;
                  bVar3 = ParsePolicyMappings(local_338,policy_mappings_tlv,
                                              (vector<bssl::ParsedPolicyMapping,_std::allocator<bssl::ParsedPolicyMapping>_>
                                               *)pPVar11);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing policy mappings");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_358,
                           (uchar (*) [3])&kInhibitAnyPolicyOid);
                bssl::der::Input::Input((Input *)&local_348,local_358);
                bVar3 = GetExtension(peVar4,(Input)local_348,(ParsedExtension *)local_160);
                if (bVar3) {
                  local_378 = extension.oid.data_.size_;
                  puStack_370 = extension.value.data_.data_;
                  inhibit_any_policy_tlv.data_.size_ = extraout_RDX;
                  inhibit_any_policy_tlv.data_.data_ = extension.value.data_.data_;
                  local_35a = (_Optional_payload_base<unsigned_char>)
                              ParseInhibitAnyPolicy
                                        ((bssl *)extension.oid.data_.size_,inhibit_any_policy_tlv);
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  (peVar4->inhibit_any_policy_).super__Optional_base<unsigned_char,_true,_true>.
                  _M_payload.super__Optional_payload_base<unsigned_char> = local_35a;
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  bVar3 = ::std::optional::operator_cast_to_bool
                                    ((optional *)&peVar4->inhibit_any_policy_);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing inhibit any policy");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_398,
                           (uchar (*) [3])&kSubjectKeyIdentifierOid);
                bssl::der::Input::Input((Input *)&local_388,local_398);
                bVar3 = GetExtension(peVar4,(Input)local_388,(ParsedExtension *)local_160);
                if (bVar3) {
                  ::std::make_optional<bssl::der::Input>();
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  *(Input **)
                   &(peVar4->subject_key_identifier_).
                    super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                    super__Optional_payload_base<bssl::der::Input>._M_engaged = local_3a0;
                  (peVar4->subject_key_identifier_).
                  super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                  super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.data_ =
                       local_3b0;
                  (peVar4->subject_key_identifier_).
                  super__Optional_base<bssl::der::Input,_true,_true>._M_payload.
                  super__Optional_payload_base<bssl::der::Input>._M_payload._M_value.data_.size_ =
                       sStack_3a8;
                  local_3c8 = (bssl *)extension.oid.data_.size_;
                  puStack_3c0 = extension.value.data_.data_;
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  pIVar9 = ::std::optional<bssl::der::Input>::value
                                     (&peVar4->subject_key_identifier_);
                  extension_value_01.data_.size_ = (size_t)pIVar9;
                  extension_value_01.data_.data_ = puStack_3c0;
                  bVar3 = ParseSubjectKeyIdentifier(local_3c8,extension_value_01,local_3a0);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing subject key identifier");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
                peVar4 = ::std::
                         __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_50);
                Span<unsigned_char_const>::Span<3ul>
                          ((Span<unsigned_char_const> *)&local_3e8,
                           (uchar (*) [3])&kAuthorityKeyIdentifierOid);
                bssl::der::Input::Input((Input *)&local_3d8,local_3e8);
                authority_key_identifier = (ParsedAuthorityKeyIdentifier *)local_160;
                bVar3 = GetExtension(peVar4,(Input)local_3d8,
                                     (ParsedExtension *)authority_key_identifier);
                if (bVar3) {
                  ::std::make_optional<bssl::ParsedAuthorityKeyIdentifier>();
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  ::std::optional<bssl::ParsedAuthorityKeyIdentifier>::operator=
                            (&peVar4->authority_key_identifier_,&local_438);
                  ::std::optional<bssl::ParsedAuthorityKeyIdentifier>::~optional(&local_438);
                  peVar4 = ::std::
                           __shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_50);
                  pPVar10 = ::std::optional<bssl::ParsedAuthorityKeyIdentifier>::value
                                      (&peVar4->authority_key_identifier_);
                  extension_value_02.data_.size_ = (size_t)pPVar10;
                  extension_value_02.data_.data_ = extension.value.data_.data_;
                  bVar3 = ParseAuthorityKeyIdentifier
                                    ((bssl *)extension.oid.data_.size_,extension_value_02,
                                     authority_key_identifier);
                  if (!bVar3) {
                    CertErrors::AddError
                              ((CertErrors *)
                               unused_errors.nodes_.
                               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               "Failed parsing authority key identifier");
                    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
                    goto LAB_005f4444;
                  }
                }
              }
              ::std::shared_ptr<bssl::ParsedCertificate_const>::
              shared_ptr<bssl::ParsedCertificate,void>
                        ((shared_ptr<bssl::ParsedCertificate_const> *)this,
                         (shared_ptr<bssl::ParsedCertificate> *)local_50);
            }
            else {
              CertErrors::AddError
                        ((CertErrors *)
                         unused_errors.nodes_.
                         super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,
                         "Failed normalizing issuer");
              ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                        ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
            }
          }
          else {
            CertErrors::AddError
                      ((CertErrors *)
                       unused_errors.nodes_.
                       super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage,"Failed reading issuer or subject"
                      );
            ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                      ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
          }
        }
        else {
          CertErrors::AddError
                    ((CertErrors *)
                     unused_errors.nodes_.
                     super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,"Failed normalizing subject");
          ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                    ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
        }
      }
      else {
        CertErrors::AddError
                  ((CertErrors *)
                   unused_errors.nodes_.
                   super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,"Failed reading issuer or subject");
        ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                  ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
      }
    }
    else {
      CertErrors::AddError
                ((CertErrors *)
                 unused_errors.nodes_.
                 super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,"Failed parsing TBSCertificate");
      ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
                ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
    }
  }
  else {
    CertErrors::AddError
              ((CertErrors *)
               unused_errors.nodes_.
               super__Vector_base<bssl::CertError,_std::allocator<bssl::CertError>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage,"Failed parsing Certificate");
    ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
              ((shared_ptr<const_bssl::ParsedCertificate> *)this,(nullptr_t)0x0);
  }
LAB_005f4444:
  ::std::shared_ptr<bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<bssl::ParsedCertificate> *)local_50);
  CertErrors::~CertErrors
            ((CertErrors *)
             &result.super___shared_ptr<bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  sVar12.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX_00._M_pi;
  sVar12.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this
  ;
  return (shared_ptr<const_bssl::ParsedCertificate>)
         sVar12.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const ParsedCertificate> ParsedCertificate::Create(
    bssl::UniquePtr<CRYPTO_BUFFER> backing_data,
    const ParseCertificateOptions &options, CertErrors *errors) {
  // |errors| is an optional parameter, but to keep the code simpler, use a
  // dummy object when one wasn't provided.
  CertErrors unused_errors;
  if (!errors) {
    errors = &unused_errors;
  }

  auto result = std::make_shared<ParsedCertificate>(PrivateConstructor{});
  result->cert_data_ = std::move(backing_data);
  result->cert_ = der::Input(CRYPTO_BUFFER_data(result->cert_data_.get()),
                             CRYPTO_BUFFER_len(result->cert_data_.get()));

  if (!ParseCertificate(result->cert_, &result->tbs_certificate_tlv_,
                        &result->signature_algorithm_tlv_,
                        &result->signature_value_, errors)) {
    errors->AddError(kFailedParsingCertificate);
    return nullptr;
  }

  if (!ParseTbsCertificate(result->tbs_certificate_tlv_, options, &result->tbs_,
                           errors)) {
    errors->AddError(kFailedParsingTbsCertificate);
    return nullptr;
  }

  // Attempt to parse the signature algorithm contained in the Certificate.
  result->signature_algorithm_ =
      ParseSignatureAlgorithm(result->signature_algorithm_tlv_);

  der::Input subject_value;
  if (!GetSequenceValue(result->tbs_.subject_tlv, &subject_value)) {
    errors->AddError(kFailedReadingIssuerOrSubject);
    return nullptr;
  }
  if (!NormalizeName(subject_value, &result->normalized_subject_, errors)) {
    errors->AddError(kFailedNormalizingSubject);
    return nullptr;
  }
  der::Input issuer_value;
  if (!GetSequenceValue(result->tbs_.issuer_tlv, &issuer_value)) {
    errors->AddError(kFailedReadingIssuerOrSubject);
    return nullptr;
  }
  if (!NormalizeName(issuer_value, &result->normalized_issuer_, errors)) {
    errors->AddError(kFailedNormalizingIssuer);
    return nullptr;
  }

  // Parse the standard X.509 extensions.
  if (result->tbs_.extensions_tlv) {
    // ParseExtensions() ensures there are no duplicates, and maps the (unique)
    // OID to the extension value.
    if (!ParseExtensions(result->tbs_.extensions_tlv.value(),
                         &result->extensions_)) {
      errors->AddError(kFailedParsingExtensions);
      return nullptr;
    }

    ParsedExtension extension;

    // Basic constraints.
    if (result->GetExtension(der::Input(kBasicConstraintsOid), &extension)) {
      result->has_basic_constraints_ = true;
      if (!ParseBasicConstraints(extension.value,
                                 &result->basic_constraints_)) {
        errors->AddError(kFailedParsingBasicConstraints);
        return nullptr;
      }
    }

    // Key Usage.
    if (result->GetExtension(der::Input(kKeyUsageOid), &extension)) {
      result->has_key_usage_ = true;
      if (!ParseKeyUsage(extension.value, &result->key_usage_)) {
        errors->AddError(kFailedParsingKeyUsage);
        return nullptr;
      }
    }

    // Extended Key Usage.
    if (result->GetExtension(der::Input(kExtKeyUsageOid), &extension)) {
      result->has_extended_key_usage_ = true;
      if (!ParseEKUExtension(extension.value, &result->extended_key_usage_)) {
        errors->AddError(kFailedParsingEku);
        return nullptr;
      }
    }

    // Subject alternative name.
    if (result->GetExtension(der::Input(kSubjectAltNameOid),
                             &result->subject_alt_names_extension_)) {
      // RFC 5280 section 4.2.1.6:
      // SubjectAltName ::= GeneralNames
      result->subject_alt_names_ = GeneralNames::Create(
          result->subject_alt_names_extension_.value, errors);
      if (!result->subject_alt_names_) {
        errors->AddError(kFailedParsingSubjectAltName);
        return nullptr;
      }
      // RFC 5280 section 4.1.2.6:
      // If subject naming information is present only in the subjectAltName
      // extension (e.g., a key bound only to an email address or URI), then the
      // subject name MUST be an empty sequence and the subjectAltName extension
      // MUST be critical.
      if (subject_value.empty() &&
          !result->subject_alt_names_extension_.critical) {
        errors->AddError(kSubjectAltNameNotCritical);
        return nullptr;
      }
    }

    // Name constraints.
    if (result->GetExtension(der::Input(kNameConstraintsOid), &extension)) {
      result->name_constraints_ =
          NameConstraints::Create(extension.value, extension.critical, errors);
      if (!result->name_constraints_) {
        errors->AddError(kFailedParsingNameConstraints);
        return nullptr;
      }
    }

    // Authority information access.
    if (result->GetExtension(der::Input(kAuthorityInfoAccessOid),
                             &result->authority_info_access_extension_)) {
      result->has_authority_info_access_ = true;
      if (!ParseAuthorityInfoAccessURIs(
              result->authority_info_access_extension_.value,
              &result->ca_issuers_uris_, &result->ocsp_uris_)) {
        errors->AddError(kFailedParsingAia);
        return nullptr;
      }
    }

    // Policies.
    if (result->GetExtension(der::Input(kCertificatePoliciesOid), &extension)) {
      result->has_policy_oids_ = true;
      if (!ParseCertificatePoliciesExtensionOids(
              extension.value, false /*fail_parsing_unknown_qualifier_oids*/,
              &result->policy_oids_, errors)) {
        errors->AddError(kFailedParsingPolicies);
        return nullptr;
      }
    }

    // Policy constraints.
    if (result->GetExtension(der::Input(kPolicyConstraintsOid), &extension)) {
      result->has_policy_constraints_ = true;
      if (!ParsePolicyConstraints(extension.value,
                                  &result->policy_constraints_)) {
        errors->AddError(kFailedParsingPolicyConstraints);
        return nullptr;
      }
    }

    // Policy mappings.
    if (result->GetExtension(der::Input(kPolicyMappingsOid), &extension)) {
      result->has_policy_mappings_ = true;
      if (!ParsePolicyMappings(extension.value, &result->policy_mappings_)) {
        errors->AddError(kFailedParsingPolicyMappings);
        return nullptr;
      }
    }

    // Inhibit Any Policy.
    if (result->GetExtension(der::Input(kInhibitAnyPolicyOid), &extension)) {
      result->inhibit_any_policy_ = ParseInhibitAnyPolicy(extension.value);
      if (!result->inhibit_any_policy_) {
        errors->AddError(kFailedParsingInhibitAnyPolicy);
        return nullptr;
      }
    }

    // Subject Key Identifier.
    if (result->GetExtension(der::Input(kSubjectKeyIdentifierOid),
                             &extension)) {
      result->subject_key_identifier_ = std::make_optional<der::Input>();
      if (!ParseSubjectKeyIdentifier(
              extension.value, &result->subject_key_identifier_.value())) {
        errors->AddError(kFailedParsingSubjectKeyIdentifier);
        return nullptr;
      }
    }

    // Authority Key Identifier.
    if (result->GetExtension(der::Input(kAuthorityKeyIdentifierOid),
                             &extension)) {
      result->authority_key_identifier_ =
          std::make_optional<ParsedAuthorityKeyIdentifier>();
      if (!ParseAuthorityKeyIdentifier(
              extension.value, &result->authority_key_identifier_.value())) {
        errors->AddError(kFailedParsingAuthorityKeyIdentifier);
        return nullptr;
      }
    }
  }

  return result;
}